

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * ODDLParser::OpenDDLParser::parseDataArrayList
                 (char *in,char *end,ValueType type,DataArrayList **dataArrayList)

{
  byte bVar1;
  DataArrayList *pDVar2;
  DataArrayList **ppDVar3;
  byte *in_00;
  byte *pbVar4;
  DataArrayList *pDVar5;
  size_t numValues;
  size_t numRefs;
  Reference *refs;
  size_t local_58;
  size_t local_50;
  Reference *local_48;
  Value *local_40;
  DataArrayList **local_38;
  
  if ((dataArrayList != (DataArrayList **)0x0) &&
     (*dataArrayList = (DataArrayList *)0x0, in != end && in != (char *)0x0)) {
    do {
      bVar1 = *in;
      if ((0x2c < (ulong)bVar1) || ((0x100100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
      goto LAB_00667859;
      in = (char *)((byte *)in + 1);
    } while (in != end);
    bVar1 = *end;
    in = end;
LAB_00667859:
    if (bVar1 == 0x7b) {
      in_00 = (byte *)in + 1;
      local_48 = (Reference *)0x0;
      pDVar5 = (DataArrayList *)0x0;
      local_38 = dataArrayList;
      do {
        local_50 = 0;
        local_58 = 0;
        local_40 = (Value *)0x0;
        in_00 = (byte *)parseDataList((char *)in_00,end,type,&local_40,&local_58,&local_48,&local_50
                                     );
        pDVar2 = pDVar5;
        if (local_40 != (Value *)0x0 || local_50 != 0) {
          pDVar2 = createDataArrayList(local_40,local_58,local_48,local_50);
          ppDVar3 = &pDVar5->m_next;
          if (pDVar5 == (DataArrayList *)0x0) {
            ppDVar3 = local_38;
          }
          *ppDVar3 = pDVar2;
        }
        pbVar4 = in_00;
      } while ((in_00 != (byte *)end) && (pDVar5 = pDVar2, *in_00 == 0x2c));
      while ((in_00 != (byte *)end &&
             ((pbVar4 = in_00, (ulong)*in_00 < 0x2d &&
              ((0x100100002600U >> ((ulong)*in_00 & 0x3f) & 1) != 0))))) {
        in_00 = in_00 + 1;
        pbVar4 = (byte *)end;
      }
      in = (char *)(pbVar4 + 1);
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseDataArrayList( char *in, char *end,Value::ValueType type, 
                                         DataArrayList **dataArrayList ) {
    if ( ddl_nullptr == dataArrayList ) {
        return in;
    }

    *dataArrayList = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in == Grammar::OpenBracketToken[ 0 ] ) {
        ++in;
        Value *currentValue( ddl_nullptr );
        Reference *refs( ddl_nullptr );
        DataArrayList *prev( ddl_nullptr ), *currentDataList( ddl_nullptr );
        do {
            size_t numRefs( 0 ), numValues( 0 );
            currentValue = ddl_nullptr;

            in = parseDataList( in, end, type, &currentValue, numValues, &refs, numRefs );
            if( ddl_nullptr != currentValue || 0 != numRefs ) {
                if( ddl_nullptr == prev ) {
                    *dataArrayList = createDataArrayList( currentValue, numValues, refs, numRefs );
                    prev = *dataArrayList;
                } else {
                    currentDataList = createDataArrayList( currentValue, numValues, refs, numRefs );
                    if( ddl_nullptr != prev ) {
                        prev->m_next = currentDataList;
                        prev = currentDataList;
                    }
                }
            }
        } while( Grammar::CommaSeparator[ 0 ] == *in && in != end );
        in = lookForNextToken( in, end );
        ++in;
    }

    return in;
}